

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::SwitchPrivate::SwitchPrivate(SwitchPrivate *this,Switch *parent)

{
  Switch *parent_local;
  SwitchPrivate *this_local;
  
  this->q = parent;
  this->state = AcceptedUncheck;
  QString::QString(&this->onText);
  QString::QString(&this->offText);
  QColor::QColor(&this->onColor);
  this->radius = 0;
  this->textWidth = 0;
  this->offset = 0;
  this->mouseMoveDelta = 0;
  this->leftMouseButtonPressed = false;
  QPoint::QPoint(&this->mousePos);
  init(this,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

explicit SwitchPrivate( Switch * parent )
		:	q( parent )
		,	state( Switch::AcceptedUncheck )
		,	radius( 0 )
		,	textWidth( 0 )
		,	offset( 0 )
		,	mouseMoveDelta( 0 )
		,	leftMouseButtonPressed( false )
	{
		init();
	}